

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

QString * __thiscall QAction::toolTip(QString *__return_storage_ptr__,QAction *this)

{
  long lVar1;
  long lVar2;
  QArrayDataPointer<char16_t> *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if (*(long *)(lVar1 + 0xd0) == 0) {
    lVar2 = *(long *)(lVar1 + 0x98);
    if (lVar2 == 0) {
      local_48.d = *(Data **)(lVar1 + 0xa0);
      local_48.ptr = *(char16_t **)(lVar1 + 0xa8);
      local_48.size = *(qsizetype *)(lVar1 + 0xb0);
      this_00 = &local_48;
      if (local_48.d != (Data *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        this_00 = &local_48;
      }
    }
    else {
      local_30.d = *(Data **)(lVar1 + 0x88);
      local_30.ptr = *(char16_t **)(lVar1 + 0x90);
      if (local_30.d != (Data *)0x0) {
        LOCK();
        ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      this_00 = &local_30;
      local_30.size = lVar2;
    }
    qt_strippedText(__return_storage_ptr__,(QString *)this_00);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_005003d2;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_005003d2:
      __stack_chk_fail();
    }
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(lVar1 + 0xc0));
  }
  return __return_storage_ptr__;
}

Assistant:

QString QAction::toolTip() const
{
    Q_D(const QAction);
    if (d->tooltip.isEmpty()) {
        if (!d->text.isEmpty())
            return qt_strippedText(d->text);
        return qt_strippedText(d->iconText);
    }
    return d->tooltip;
}